

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O1

Byte * __thiscall
CharStringType2Interpreter::InterpretDiv
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  Trace *this_00;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  undefined1 uVar8;
  _List_node_base *p_Var9;
  
  iVar5 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x21])
                    (this->mImplementationHelper,this);
  if (iVar5 == 0) {
    uVar2 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
    if (uVar2 < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var7 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var3 = p_Var7[1]._M_next;
      p_Var9 = p_Var7[1]._M_prev;
      (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
      _M_impl._M_node._M_size = uVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var7,0x20);
      p_Var7 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var4 = p_Var7[1]._M_next;
      p_Var6 = p_Var7[1]._M_prev;
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var7,0x20);
      if ((((ulong)p_Var4 & 1) == 0) || (((ulong)p_Var3 & 1) == 0)) {
        if (((ulong)p_Var4 & 1) != 0) {
          p_Var6 = (_List_node_base *)(double)(long)p_Var6;
        }
        if (((ulong)p_Var3 & 1) != 0) {
          p_Var9 = (_List_node_base *)(double)(long)p_Var9;
        }
        p_Var6 = (_List_node_base *)((double)p_Var6 / (double)p_Var9);
        uVar8 = 0;
      }
      else {
        p_Var6 = (_List_node_base *)((long)p_Var6 / (long)p_Var9);
        uVar8 = 1;
      }
      p_Var7 = (_List_node_base *)operator_new(0x20);
      *(undefined1 *)&p_Var7[1]._M_next = uVar8;
      p_Var7[1]._M_prev = p_Var6;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      psVar1 = &(this->mOperandStack).
                super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretDiv(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Div(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;


	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretDiv, div should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	if(!valueA.IsInteger || !valueB.IsInteger)
	{
		newOperand.IsInteger = false;
		newOperand.RealValue = 
			(valueA.IsInteger ? (double)valueA.IntegerValue : valueA.RealValue)
			/
			(valueB.IsInteger ? (double)valueB.IntegerValue : valueB.RealValue);
	}
	else
	{
		newOperand.IsInteger = true;
		newOperand.IntegerValue = valueA.IntegerValue / valueB.IntegerValue;
	}
	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}